

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O2

void __thiscall
bssl::gtest_suite_PkitsTest14DistributionPoints_::
Section14InvalidIDPwithindirectCRLTest26<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
::~Section14InvalidIDPwithindirectCRLTest26
          (Section14InvalidIDPwithindirectCRLTest26<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest14DistributionPoints,
                     Section14InvalidIDPwithindirectCRLTest26) {
  const char* const certs[] = {"TrustAnchorRootCertificate",
                               "indirectCRLCA2Cert", "indirectCRLCA1Cert",
                               "InvalidIDPwithindirectCRLTest26EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "indirectCRLCA1CRL"};
  PkitsTestInfo info;
  info.test_number = "4.14.26";
  info.should_validate = false;

  this->RunTest(certs, crls, info);
}